

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigOutDec.c
# Opt level: O0

Aig_Man_t * Saig_ManDecPropertyOutput(Aig_Man_t *pAig,int nLits,int fVerbose)

{
  Vec_Ptr_t *p;
  Aig_Man_t *p_00;
  int iVar1;
  int i_00;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *p1;
  Vec_Int_t *p_01;
  int local_48;
  int Lit;
  int k;
  int i;
  Vec_Int_t *vCube;
  Vec_Ptr_t *vPrimes;
  Aig_Obj_t *pMiter;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAigNew;
  int fVerbose_local;
  int nLits_local;
  Aig_Man_t *pAig_local;
  
  pObj = (Aig_Obj_t *)0x0;
  pAigNew._0_4_ = fVerbose;
  pAigNew._4_4_ = nLits;
  _fVerbose_local = pAig;
  vCube = (Vec_Int_t *)Saig_ManFindPrimes(pAig,nLits,fVerbose);
  iVar1 = Aig_ManNodeNum(_fVerbose_local);
  pObj = (Aig_Obj_t *)Aig_ManStart(iVar1);
  pAVar2 = (Aig_Obj_t *)Abc_UtilStrsav(_fVerbose_local->pName);
  (pObj->field_0).pNext = pAVar2;
  *(int *)&pObj[2].field_0x18 = _fVerbose_local->nConstrs;
  pAVar2 = Aig_ManConst1((Aig_Man_t *)pObj);
  pAVar3 = Aig_ManConst1(_fVerbose_local);
  (pAVar3->field_5).pData = pAVar2;
  for (Lit = 0; iVar1 = Vec_PtrSize(_fVerbose_local->vCis), Lit < iVar1; Lit = Lit + 1) {
    pMiter = (Aig_Obj_t *)Vec_PtrEntry(_fVerbose_local->vCis,Lit);
    pAVar2 = Aig_ObjCreateCi((Aig_Man_t *)pObj);
    (pMiter->field_5).pData = pAVar2;
  }
  for (Lit = 0; iVar1 = Vec_PtrSize(_fVerbose_local->vObjs), Lit < iVar1; Lit = Lit + 1) {
    pMiter = (Aig_Obj_t *)Vec_PtrEntry(_fVerbose_local->vObjs,Lit);
    if ((pMiter != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pMiter), pAVar2 = pObj, iVar1 != 0))
    {
      pAVar3 = Aig_ObjChild0Copy(pMiter);
      p1 = Aig_ObjChild1Copy(pMiter);
      pAVar2 = Aig_And((Aig_Man_t *)pAVar2,pAVar3,p1);
      (pMiter->field_5).pData = pAVar2;
    }
  }
  for (Lit = 0; iVar1 = Saig_ManPoNum(_fVerbose_local), Lit < iVar1; Lit = Lit + 1) {
    pMiter = (Aig_Obj_t *)Vec_PtrEntry(_fVerbose_local->vCos,Lit);
    pAVar2 = pObj;
    pAVar3 = Aig_ObjChild0Copy(pMiter);
    Aig_ObjCreateCo((Aig_Man_t *)pAVar2,pAVar3);
  }
  if (vCube != (Vec_Int_t *)0x0) {
    for (local_48 = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)vCube), local_48 < iVar1;
        local_48 = local_48 + 1) {
      p_01 = (Vec_Int_t *)Vec_PtrEntry((Vec_Ptr_t *)vCube,local_48);
      vPrimes = (Vec_Ptr_t *)Aig_ManConst1((Aig_Man_t *)pObj);
      for (Lit = 0; iVar1 = Vec_IntSize(p_01), Lit < iVar1; Lit = Lit + 1) {
        iVar1 = Vec_IntEntry(p_01,Lit);
        p_00 = _fVerbose_local;
        i_00 = Abc_Lit2Var(iVar1);
        pAVar2 = Aig_ManObj(p_00,i_00);
        pAVar2 = Aig_ObjCopy(pAVar2);
        iVar1 = Abc_LitIsCompl(iVar1);
        pMiter = Aig_NotCond(pAVar2,iVar1);
        vPrimes = (Vec_Ptr_t *)Aig_And((Aig_Man_t *)pObj,(Aig_Obj_t *)vPrimes,pMiter);
      }
      Aig_ObjCreateCo((Aig_Man_t *)pObj,(Aig_Obj_t *)vPrimes);
    }
  }
  for (Lit = 0; iVar1 = Saig_ManRegNum(_fVerbose_local), Lit < iVar1; Lit = Lit + 1) {
    p = _fVerbose_local->vCos;
    iVar1 = Saig_ManPoNum(_fVerbose_local);
    pMiter = (Aig_Obj_t *)Vec_PtrEntry(p,Lit + iVar1);
    pAVar2 = pObj;
    pAVar3 = Aig_ObjChild0Copy(pMiter);
    Aig_ObjCreateCo((Aig_Man_t *)pAVar2,pAVar3);
  }
  Aig_ManCleanup((Aig_Man_t *)pObj);
  pAVar2 = pObj;
  iVar1 = Aig_ManRegNum(_fVerbose_local);
  Aig_ManSetRegNum((Aig_Man_t *)pAVar2,iVar1);
  Vec_VecFreeP((Vec_Vec_t **)&vCube);
  return (Aig_Man_t *)pObj;
}

Assistant:

Aig_Man_t * Saig_ManDecPropertyOutput( Aig_Man_t * pAig, int nLits, int fVerbose )
{
    Aig_Man_t * pAigNew = NULL;
    Aig_Obj_t * pObj, * pMiter;
    Vec_Ptr_t * vPrimes;
    Vec_Int_t * vCube;
    int i, k, Lit;

    // compute primes of the comb output function
    vPrimes = Saig_ManFindPrimes( pAig, nLits, fVerbose );

    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    pAigNew->nConstrs = pAig->nConstrs;
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create original POs of the circuit
    Saig_ManForEachPo( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    // create prime POs of the circuit
    if ( vPrimes )
    Vec_PtrForEachEntry( Vec_Int_t *, vPrimes, vCube, k )
    {
        pMiter = Aig_ManConst1( pAigNew );
        Vec_IntForEachEntry( vCube, Lit, i )
        {
            pObj = Aig_NotCond( Aig_ObjCopy(Aig_ManObj(pAig, Abc_Lit2Var(Lit))), Abc_LitIsCompl(Lit) );
            pMiter = Aig_And( pAigNew, pMiter, pObj );
        }
        Aig_ObjCreateCo( pAigNew, pMiter );
    }
    // transfer to register outputs
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManCleanup( pAigNew );
    Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );

    Vec_VecFreeP( (Vec_Vec_t **)&vPrimes );
    return pAigNew;
}